

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O3

string * __thiscall
helics::fileops::tomlAsString_abi_cxx11_
          (string *__return_storage_ptr__,fileops *this,value *element)

{
  fileops fVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint __len;
  ulong __val;
  ostringstream str;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  fVar1 = *this;
  if (fVar1 == (fileops)0x2) {
    uVar2 = *(ulong *)(this + 8);
    __val = -uVar2;
    if (0 < (long)uVar2) {
      __val = uVar2;
    }
    __len = 1;
    if (9 < __val) {
      uVar5 = __val;
      uVar4 = 4;
      do {
        __len = uVar4;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_003a520f;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_003a520f;
        }
        if (uVar5 < 10000) goto LAB_003a520f;
        bVar3 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        uVar4 = __len + 4;
      } while (bVar3);
      __len = __len + 1;
    }
LAB_003a520f:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,(ulong)(__len - (int)((long)uVar2 >> 0x3f)),'-');
    CLI::std::__detail::__to_chars_10_impl<unsigned_long>
              ((__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar2 >> 0x3f),__len,__val);
  }
  else if (fVar1 == (fileops)0x3) {
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (__return_storage_ptr__,vsnprintf,0x148,"%f",*(undefined8 *)(this + 8));
  }
  else if (fVar1 == (fileops)0x4) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(this + 8),
               *(long *)(this + 0x10) + *(long *)(this + 8));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(aoStack_198);
    toml::operator<<((ostream *)aoStack_198,(basic_value<toml::type_config> *)this);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(aoStack_198);
    std::ios_base::~ios_base(local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string tomlAsString(const toml::value& element)
{
    switch (element.type()) {
        case toml::value_t::string:
            return element.as_string(std::nothrow_t());  // NOLINT
        case toml::value_t::floating:
            return std::to_string(element.as_floating(std::nothrow_t()));
        case toml::value_t::integer:
            return std::to_string(element.as_integer(std::nothrow_t()));
        default: {
            std::ostringstream str;
            str << element;
            return str.str();
        }
    }
}